

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

bounded_buffer * peparse::makeBufferFromPointer(uint8_t *data,uint32_t sz)

{
  bounded_buffer *__lhs;
  uint32_t in_ESI;
  uint8_t *in_RDI;
  bounded_buffer *p;
  _func_ios_base_ptr_ios_base_ptr *in_stack_000000c0;
  uint in_stack_000000cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_stack_ffffffffffffff28;
  bounded_buffer *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0 [39];
  undefined1 local_79;
  bounded_buffer *local_78;
  bounded_buffer *local_70;
  string local_58 [32];
  string local_38 [36];
  uint32_t local_14;
  uint8_t *local_10;
  bounded_buffer *local_8;
  
  if (in_RDI == (uint8_t *)0x0) {
    err = 1;
    std::__cxx11::string::assign(err_loc_abi_cxx11_);
    to_string<unsigned_int>(in_stack_000000cc,in_stack_000000c0);
    std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_38);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
    local_8 = (bounded_buffer *)0x0;
  }
  else {
    local_14 = in_ESI;
    local_10 = in_RDI;
    __lhs = (bounded_buffer *)operator_new(0x18,(nothrow_t *)&std::nothrow);
    local_79 = 0;
    local_d0 = (bounded_buffer *)0x0;
    if (__lhs != (bounded_buffer *)0x0) {
      local_79 = 1;
      local_78 = __lhs;
      memset(__lhs,0,0x18);
      local_d0 = __lhs;
    }
    local_70 = local_d0;
    if (local_d0 == (bounded_buffer *)0x0) {
      err = 1;
      std::__cxx11::string::assign(err_loc_abi_cxx11_);
      __rhs = &local_c0;
      to_string<unsigned_int>(in_stack_000000cc,in_stack_000000c0);
      std::operator+((char *)__lhs,__rhs);
      std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      local_8 = (bounded_buffer *)0x0;
    }
    else {
      local_d0->copy = true;
      local_d0->detail = (buffer_detail *)0x0;
      local_d0->buf = local_10;
      local_d0->bufLen = local_14;
      local_d0->swapBytes = false;
      local_8 = local_d0;
    }
  }
  return local_8;
}

Assistant:

bounded_buffer *makeBufferFromPointer(std::uint8_t *data, std::uint32_t sz) {
  if (data == nullptr) {
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  bounded_buffer *p = new (std::nothrow) bounded_buffer();

  if (p == nullptr) {
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  p->copy = true;
  p->detail = nullptr;
  p->buf = data;
  p->bufLen = sz;
  p->swapBytes = false;

  return p;
}